

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve_network.cpp
# Opt level: O0

void __thiscall polyscope::CurveNetwork::refresh(CurveNetwork *this)

{
  __shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2> *unaff_retaddr;
  QuantityStructure<polyscope::CurveNetwork> *in_stack_00000030;
  
  recomputeGeometryIfPopulated((CurveNetwork *)0x4ade58);
  std::__shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>::reset
            (unaff_retaddr);
  std::__shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>::reset
            (unaff_retaddr);
  std::__shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>::reset
            (unaff_retaddr);
  std::__shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>::reset
            (unaff_retaddr);
  requestRedraw();
  QuantityStructure<polyscope::CurveNetwork>::refresh(in_stack_00000030);
  return;
}

Assistant:

void CurveNetwork::refresh() {
  recomputeGeometryIfPopulated();

  nodeProgram.reset();
  edgeProgram.reset();
  nodePickProgram.reset();
  edgePickProgram.reset();
  requestRedraw();
  QuantityStructure<CurveNetwork>::refresh(); // call base class version, which refreshes quantities
}